

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *window,bool write)

{
  int iVar1;
  ImGuiContext *pIVar2;
  short *psVar3;
  int n_5;
  int n_4;
  int n_3;
  int n_2;
  int n_1;
  int n;
  short *p;
  ImGuiContext *g;
  bool write_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  psVar3 = (window->DC).StackSizesBackup;
  iVar1 = (window->IDStack).Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 != iVar1) {
    __assert_fail("*p == n && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bee,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  psVar3 = (window->DC).StackSizesBackup + 1;
  iVar1 = (window->DC).GroupStack.Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 != iVar1) {
    __assert_fail("*p == n && \"BeginGroup/EndGroup Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bef,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  psVar3 = (window->DC).StackSizesBackup + 2;
  iVar1 = (pIVar2->BeginPopupStack).Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 != iVar1) {
    __assert_fail("*p == n && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bf3,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  psVar3 = (window->DC).StackSizesBackup + 3;
  iVar1 = (pIVar2->ColorModifiers).Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 < iVar1) {
    __assert_fail("*p >= n && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bf4,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  psVar3 = (window->DC).StackSizesBackup + 4;
  iVar1 = (pIVar2->StyleModifiers).Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 < iVar1) {
    __assert_fail("*p >= n && \"PushStyleVar/PopStyleVar Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bf5,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  psVar3 = (window->DC).StackSizesBackup + 5;
  iVar1 = (pIVar2->FontStack).Size;
  if (write) {
    *psVar3 = (short)iVar1;
  }
  else if (*psVar3 < iVar1) {
    __assert_fail("*p >= n && \"PushFont/PopFont Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bf6,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  return;
}

Assistant:

static void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow* window, bool write)
{
    ImGuiContext& g = *GImGui;
    short* p = &window->DC.StackSizesBackup[0];

    // Window stacks
    // NOT checking: DC.ItemWidth, DC.AllowKeyboardFocus, DC.ButtonRepeat, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    { int n = window->IDStack.Size;       if (write) *p = (short)n; else IM_ASSERT(*p == n && "PushID/PopID or TreeNode/TreePop Mismatch!");   p++; }    // Too few or too many PopID()/TreePop()
    { int n = window->DC.GroupStack.Size; if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginGroup/EndGroup Mismatch!");                p++; }    // Too few or too many EndGroup()

    // Global stacks
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    { int n = g.BeginPopupStack.Size;     if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!"); p++; }// Too few or too many EndMenu()/EndPopup()
    { int n = g.ColorModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleColor/PopStyleColor Mismatch!");       p++; }    // Too few or too many PopStyleColor()
    { int n = g.StyleModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleVar/PopStyleVar Mismatch!");           p++; }    // Too few or too many PopStyleVar()
    { int n = g.FontStack.Size;           if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushFont/PopFont Mismatch!");                   p++; }    // Too few or too many PopFont()
    IM_ASSERT(p == window->DC.StackSizesBackup + IM_ARRAYSIZE(window->DC.StackSizesBackup));
}